

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t *this;
  pointer *ppPVar1;
  double dVar2;
  double dVar3;
  uchar uVar4;
  __type _Var5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  _InputArray *p_Var10;
  double *pdVar11;
  uchar *puVar12;
  byte *pbVar13;
  mapped_type *this_00;
  size_type sVar14;
  pointer ppVar15;
  pointer ppVar16;
  ulong uVar17;
  size_type sVar18;
  reference pt;
  rep rVar19;
  char *pcVar20;
  int in_R8D;
  _InputArray *local_11b8;
  _InputArray *local_f60;
  time_t local_f10;
  time_t end_time;
  duration<long,_std::ratio<1L,_1000L>_> local_f00;
  int local_ef4;
  duration dStack_ef0;
  int elapsed_seconds;
  vector<int,_std::allocator<int>_> local_ee8;
  _InputArray local_ec8;
  string local_eb0 [8];
  string s;
  stringstream sstm;
  ostream local_e80 [380];
  Point_<int> local_d04;
  Point p_1;
  int i_2;
  Mat_<unsigned_char> local_cf0 [352];
  MatExpr local_b90 [8];
  Mat maskFinal;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_b28;
  const_iterator local_b20;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_b18;
  const_iterator local_b10;
  int local_b04;
  iterator iStack_b00;
  int t_1;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_af8;
  const_iterator local_af0;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_ae8;
  const_iterator local_ae0;
  int local_ad4;
  _Self _Stack_ad0;
  int t;
  reference_wrapper<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> local_ac8;
  thread local_ac0;
  _Self local_ab8;
  _Base_ptr local_ab0;
  undefined1 local_aa8 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> shadowPoints;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int poolSize;
  undefined1 local_a68 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> labPixels;
  int local_a3c;
  int labMapPixels;
  pair<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_a28;
  undefined1 local_a00 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> v;
  undefined1 local_9d8 [8];
  tuple<int,_int,_int> key;
  int theB;
  int theA;
  int theL;
  Point p;
  int j_1;
  int i_1;
  iterator labIt;
  map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
  labMap;
  _InputArray local_958;
  allocator<char> local_939;
  string local_938 [36];
  int local_914;
  int local_910;
  int j;
  int i;
  int maskPixels;
  Mat_<unsigned_char> local_900 [352];
  MatExpr local_7a0 [8];
  Mat maskAvgL;
  int local_794;
  _OutputArray local_740;
  _OutputArray local_728;
  _InputArray local_710;
  _OutputArray local_6f8;
  byte local_6d9;
  Mat local_6d8 [7];
  bool useSTD;
  Mat stdDevL;
  Mat local_678 [8];
  Mat meanL;
  Mat local_618 [8];
  Mat imgLD;
  _OutputArray local_5b8;
  _InputArray local_5a0;
  Mat local_588 [8];
  Mat bFiltered;
  _OutputArray local_528;
  _InputArray local_510;
  Mat local_4f8 [8];
  Mat aFiltered;
  _OutputArray local_498;
  _InputArray local_480;
  Mat local_468 [8];
  Mat lFiltered;
  Mat local_408 [8];
  Mat imgB;
  Mat local_3a8 [8];
  Mat imgA;
  undefined1 local_348 [8];
  Mat imgL;
  _InputArray local_2e8 [4];
  Mat local_288 [96];
  Mat local_228 [96];
  _InputArray local_1c8;
  _InputArray local_1b0;
  Mat local_198 [8];
  Mat imgLAB;
  string local_138 [96];
  Mat local_d8 [8];
  Mat imgRGB;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  int local_58;
  int local_54;
  int bStep;
  int aStep;
  int lStep;
  allocator<char> local_39;
  string local_38 [8];
  string srcPath;
  char **argv_local;
  int argc_local;
  
  srcPath.field_2._8_8_ = argv;
  if (argc == 5) {
    pcVar20 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar20,&local_39);
    std::allocator<char>::~allocator(&local_39);
    bStep = atoi(*(char **)(srcPath.field_2._8_8_ + 0x10));
    local_54 = atoi(*(char **)(srcPath.field_2._8_8_ + 0x18));
    local_58 = atoi(*(char **)(srcPath.field_2._8_8_ + 0x20));
    if (((local_54 < 1) || (local_58 < 1)) || (bStep < 1)) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "Wrong argument! lStep, aStep and bStep must be positive.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "Run this executable by invoking it like this: ");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50")
      ;
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(&end);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(&local_70);
      end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      cv::Mat::Mat(local_d8);
      cv::imread(local_138,(int)local_38);
      cv::Mat::operator=(local_d8,(Mat *)local_138);
      cv::Mat::~Mat((Mat *)local_138);
      bVar6 = cv::Mat::empty();
      if ((bVar6 & 1) == 0) {
        cv::Mat::Mat(local_198);
        cv::_InputArray::_InputArray(&local_1b0,local_d8);
        cv::_OutputArray::_OutputArray((_OutputArray *)&local_1c8,local_198);
        cv::cvtColor((cv *)&local_1b0,&local_1c8,(_OutputArray *)0x2d,0,in_R8D);
        cv::_OutputArray::~_OutputArray((_OutputArray *)&local_1c8);
        cv::_InputArray::~_InputArray(&local_1b0);
        local_f60 = local_2e8;
        do {
          cv::Mat::Mat((Mat *)local_f60);
          local_f60 = local_f60 + 4;
        } while (local_f60 != &local_1c8);
        cv::split(local_198,(Mat *)local_2e8);
        cv::Mat::Mat((Mat *)local_348,(Mat *)local_2e8);
        cv::Mat::Mat(local_3a8,local_288);
        cv::Mat::Mat(local_408,local_228);
        cv::Mat::Mat(local_468);
        cv::_InputArray::_InputArray(&local_480,(Mat *)local_348);
        cv::_OutputArray::_OutputArray(&local_498,local_468);
        cv::bilateralFilter(&local_480,&local_498,5,80.0,80.0,4);
        cv::_OutputArray::~_OutputArray(&local_498);
        cv::_InputArray::~_InputArray(&local_480);
        cv::Mat::operator=((Mat *)local_348,local_468);
        cv::Mat::release();
        cv::Mat::Mat(local_4f8);
        cv::_InputArray::_InputArray(&local_510,local_3a8);
        cv::_OutputArray::_OutputArray(&local_528,local_4f8);
        cv::bilateralFilter(&local_510,&local_528,5,80.0,80.0,4);
        cv::_OutputArray::~_OutputArray(&local_528);
        cv::_InputArray::~_InputArray(&local_510);
        cv::Mat::operator=(local_3a8,local_4f8);
        cv::Mat::release();
        cv::Mat::Mat(local_588);
        cv::_InputArray::_InputArray(&local_5a0,local_408);
        cv::_OutputArray::_OutputArray(&local_5b8,local_588);
        cv::bilateralFilter(&local_5a0,&local_5b8,5,80.0,80.0,4);
        cv::_OutputArray::~_OutputArray(&local_5b8);
        cv::_InputArray::~_InputArray(&local_5a0);
        cv::Mat::operator=(local_408,local_588);
        cv::Mat::release();
        cv::Mat::Mat(local_618);
        cv::Mat::Mat(local_678);
        cv::Mat::Mat(local_6d8);
        local_6d9 = 1;
        cv::_OutputArray::_OutputArray(&local_6f8,local_618);
        cv::Mat::convertTo((_OutputArray *)local_348,(int)&local_6f8,1.0,0.0);
        cv::_OutputArray::~_OutputArray(&local_6f8);
        cv::_InputArray::_InputArray(&local_710,local_618);
        cv::_OutputArray::_OutputArray(&local_728,local_678);
        cv::_OutputArray::_OutputArray(&local_740,local_6d8);
        p_Var10 = (_InputArray *)cv::noArray();
        cv::meanStdDev(&local_710,&local_728,&local_740,p_Var10);
        cv::_OutputArray::~_OutputArray(&local_740);
        cv::_OutputArray::~_OutputArray(&local_728);
        cv::_InputArray::~_InputArray(&local_710);
        pdVar11 = cv::Mat::at<double>(local_6d8,0,0);
        if (*pdVar11 <= 42.5 && *pdVar11 != 42.5) {
          local_6d9 = 0;
        }
        poVar9 = std::operator<<((ostream *)&std::cout,"Mean lightness value: ");
        pdVar11 = cv::Mat::at<double>(local_678,0,0);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pdVar11);
        poVar9 = std::operator<<(poVar9,", standard deviation: ");
        pdVar11 = cv::Mat::at<double>(local_6d8,0,0);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pdVar11);
        poVar9 = std::operator<<(poVar9," useSTD: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(bool)(local_6d9 & 1));
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        cv::MatSize::operator()((MatSize *)&i);
        cv::Mat_<unsigned_char>::zeros(local_900,(Size *)&i);
        cv::MatExpr::operator_cast_to_Mat(local_7a0);
        cv::MatExpr::~MatExpr((MatExpr *)local_900);
        j = 0;
        for (local_910 = 0; local_910 < _maskAvgL; local_910 = local_910 + 1) {
          for (local_914 = 0; local_914 < local_794; local_914 = local_914 + 1) {
            if ((local_6d9 & 1) == 0) {
              pdVar11 = cv::Mat::at<double>(local_618,local_910,local_914);
              dVar2 = *pdVar11;
              pdVar11 = cv::Mat::at<double>(local_678,0,0);
              if (*pdVar11 <= dVar2) {
                puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_7a0,local_910,local_914);
                *puVar12 = '\0';
              }
              else {
                puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_348,local_910,local_914);
                uVar4 = *puVar12;
                puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_7a0,local_910,local_914);
                *puVar12 = uVar4 + '\x01';
                j = j + 1;
              }
            }
            else {
              pdVar11 = cv::Mat::at<double>(local_618,local_910,local_914);
              dVar2 = *pdVar11;
              pdVar11 = cv::Mat::at<double>(local_678,0,0);
              dVar3 = *pdVar11;
              pdVar11 = cv::Mat::at<double>(local_6d8,0,0);
              if (dVar3 - *pdVar11 / 3.0 <= dVar2) {
                puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_7a0,local_910,local_914);
                *puVar12 = '\0';
              }
              else {
                puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_348,local_910,local_914);
                uVar4 = *puVar12;
                puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_7a0,local_910,local_914);
                *puVar12 = uVar4 + '\x01';
                j = j + 1;
              }
            }
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_938,"../results/mask_step_one.jpg",&local_939);
        cv::_InputArray::_InputArray(&local_958,(Mat *)local_7a0);
        labMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        this = &labMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
        cv::imwrite(local_938,&local_958,(vector *)this);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &labMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        cv::_InputArray::~_InputArray(&local_958);
        std::__cxx11::string::~string(local_938);
        std::allocator<char>::~allocator(&local_939);
        std::
        map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
        ::map((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
               *)&labIt);
        std::
        _Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             *)&j_1);
        for (p.y = 0; p.y < _maskAvgL; p.y = p.y + 1) {
          for (p.x = 0; p.x < local_794; p.x = p.x + 1) {
            puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_7a0,p.y,p.x);
            if (*puVar12 != '\0') {
              cv::Point_<int>::Point_((Point_<int> *)&theA,p.y,p.x);
              pbVar13 = cv::Mat::at<unsigned_char>((Mat *)local_348,p.y,p.x);
              _Var5 = std::ceil<int>((int)((long)(ulong)*pbVar13 / (long)bStep));
              theB = (int)_Var5;
              pbVar13 = cv::Mat::at<unsigned_char>(local_3a8,p.y,p.x);
              _Var5 = std::ceil<int>((int)((long)(ulong)*pbVar13 / (long)local_54));
              key.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
              _M_head_impl = (int)_Var5;
              pbVar13 = cv::Mat::at<unsigned_char>(local_408,p.y,p.x);
              _Var5 = std::ceil<int>((int)((long)(ulong)*pbVar13 / (long)local_58));
              key.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Head_base<1UL,_int,_false>._M_head_impl = (int)_Var5;
              std::make_tuple<int&,int&,int&>
                        ((int *)local_9d8,&theB,
                         &key.super__Tuple_impl<0UL,_int,_int,_int>.
                          super__Head_base<0UL,_int,_false>._M_head_impl);
              _j_1 = std::
                     map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                     ::find((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                             *)&labIt,(key_type *)local_9d8);
              v.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                            ::end((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                   *)&labIt);
              bVar7 = std::operator==((_Self *)&j_1,
                                      (_Self *)&v.
                                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar7) {
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_a00);
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_a00,
                           (value_type *)&theA);
                std::
                pair<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                ::
                pair<std::tuple<int,_int,_int>_&,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_&,_true>
                          (&local_a28,(tuple<int,_int,_int> *)local_9d8,
                           (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_a00);
                std::
                map<std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::less<std::tuple<int,int,int>>,std::allocator<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>
                ::
                insert<std::pair<std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                          ((map<std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::less<std::tuple<int,int,int>>,std::allocator<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>
                            *)&labIt,&local_a28);
                std::
                pair<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                ::~pair(&local_a28);
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_a00);
              }
              else {
                this_00 = std::
                          map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                          ::operator[]((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                        *)&labIt,(key_type *)local_9d8);
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                          (this_00,(value_type *)&theA);
              }
            }
          }
        }
        local_a3c = 0;
        _j_1 = std::
               map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
               ::begin((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                        *)&labIt);
        while( true ) {
          labPixels.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                        ::end((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                               *)&labIt);
          bVar7 = std::operator!=((_Self *)&j_1,
                                  (_Self *)&labPixels.
                                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar7) break;
          ppVar15 = std::
                    _Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ::operator->((_Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                  *)&j_1);
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_a68,
                     &ppVar15->second);
          sVar18 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                             ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                              local_a68);
          local_a3c = local_a3c + (int)sVar18;
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_a68);
          std::
          _Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        *)&j_1,0);
        }
        if (j == local_a3c) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "labMap succesfully created. Entries in labMap: ");
          sVar14 = std::
                   map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                   ::size((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                           *)&labIt);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar14);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        iVar8 = std::thread::hardware_concurrency();
        poVar9 = std::operator<<((ostream *)&std::cout,"Max threads concurrent: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)
                   &shadowPoints.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_aa8);
        local_ab0 = (_Base_ptr)
                    std::
                    map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                    ::begin((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                             *)&labIt);
        _j_1 = (iterator)local_ab0;
        while( true ) {
          local_ab8._M_node =
               (_Base_ptr)
               std::
               map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
               ::end((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                      *)&labIt);
          bVar7 = std::operator!=((_Self *)&j_1,&local_ab8);
          if (!bVar7) break;
          sVar18 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                             ((vector<std::thread,_std::allocator<std::thread>_> *)
                              &shadowPoints.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar18 < (ulong)(long)iVar8) {
            ppVar15 = std::
                      _Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    *)&j_1);
            ppVar16 = std::
                      _Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    *)&j_1);
            local_ac8 = std::ref<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                                   local_aa8);
            std::thread::
            thread<void(&)(cv::Mat,cv::Mat,cv::Mat,std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,int,int,int,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&),cv::Mat&,cv::Mat&,cv::Mat&,std::tuple<int,int,int>const&,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&,int_const&,int_const&,int_const&,std::reference_wrapper<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,void>
                      (&local_ac0,findShadow,(Mat *)local_348,local_3a8,local_408,&ppVar15->first,
                       &ppVar16->second,&bStep,&local_54,&local_58,&local_ac8);
            std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                      ((vector<std::thread,_std::allocator<std::thread>_> *)
                       &shadowPoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ac0);
            std::thread::~thread(&local_ac0);
            _Stack_ad0 = std::
                         _Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ::operator++((_Rb_tree_iterator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                       *)&j_1,0);
          }
          else {
            for (local_ad4 = 0; uVar17 = (ulong)local_ad4,
                sVar18 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                                   ((vector<std::thread,_std::allocator<std::thread>_> *)
                                    &shadowPoints.
                                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
                uVar17 < sVar18; local_ad4 = local_ad4 + 1) {
              std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         &shadowPoints.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_ad4);
              std::thread::join();
            }
            ppPVar1 = &shadowPoints.
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_ae8._M_current =
                 (thread *)
                 std::vector<std::thread,_std::allocator<std::thread>_>::begin
                           ((vector<std::thread,_std::allocator<std::thread>_> *)ppPVar1);
            __gnu_cxx::
            __normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>
            ::__normal_iterator<std::thread*>
                      ((__normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>
                        *)&local_ae0,&local_ae8);
            local_af8._M_current =
                 (thread *)
                 std::vector<std::thread,_std::allocator<std::thread>_>::end
                           ((vector<std::thread,_std::allocator<std::thread>_> *)ppPVar1);
            __gnu_cxx::
            __normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>
            ::__normal_iterator<std::thread*>
                      ((__normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>
                        *)&local_af0,&local_af8);
            iStack_b00 = std::vector<std::thread,_std::allocator<std::thread>_>::erase
                                   ((vector<std::thread,_std::allocator<std::thread>_> *)ppPVar1,
                                    local_ae0,local_af0);
          }
        }
        for (local_b04 = 0; uVar17 = (ulong)local_b04,
            sVar18 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                               ((vector<std::thread,_std::allocator<std::thread>_> *)
                                &shadowPoints.
                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage),
            uVar17 < sVar18; local_b04 = local_b04 + 1) {
          std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                    ((vector<std::thread,_std::allocator<std::thread>_> *)
                     &shadowPoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,(long)local_b04);
          std::thread::join();
        }
        ppPVar1 = &shadowPoints.
                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_b18._M_current =
             (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)ppPVar1);
        __gnu_cxx::
        __normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>::
        __normal_iterator<std::thread*>
                  ((__normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>
                    *)&local_b10,&local_b18);
        local_b28._M_current =
             (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::end
                       ((vector<std::thread,_std::allocator<std::thread>_> *)ppPVar1);
        __gnu_cxx::
        __normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>::
        __normal_iterator<std::thread*>
                  ((__normal_iterator<std::thread_const*,std::vector<std::thread,std::allocator<std::thread>>>
                    *)&local_b20,&local_b28);
        std::vector<std::thread,_std::allocator<std::thread>_>::erase
                  ((vector<std::thread,_std::allocator<std::thread>_> *)ppPVar1,local_b10,local_b20)
        ;
        cv::MatSize::operator()((MatSize *)&p_1.y);
        cv::Mat_<unsigned_char>::zeros(local_cf0,(Size *)&p_1.y);
        cv::MatExpr::operator_cast_to_Mat(local_b90);
        cv::MatExpr::~MatExpr((MatExpr *)local_cf0);
        for (p_1.x = 0; uVar17 = (ulong)p_1.x,
            sVar18 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                               ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                                local_aa8), uVar17 < sVar18; p_1.x = p_1.x + 1) {
          pt = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                         ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_aa8,
                          (long)p_1.x);
          cv::Point_<int>::Point_(&local_d04,pt);
          puVar12 = cv::Mat::at<unsigned_char>((Mat *)local_b90,local_d04.x,local_d04.y);
          *puVar12 = 0xff;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)(s.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(local_e80,"../results/mask_step_two_lStep");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,bStep);
        poVar9 = std::operator<<(poVar9,"_aStep");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_54);
        poVar9 = std::operator<<(poVar9,"_bStep");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_58);
        std::operator<<(poVar9,".jpg");
        std::__cxx11::stringstream::str();
        cv::_InputArray::_InputArray(&local_ec8,(Mat *)local_b90);
        local_ee8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_ee8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_ee8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_ee8);
        cv::imwrite(local_eb0,&local_ec8,(vector *)&local_ee8);
        std::vector<int,_std::allocator<int>_>::~vector(&local_ee8);
        cv::_InputArray::~_InputArray(&local_ec8);
        dStack_ef0.__r = std::chrono::_V2::system_clock::now();
        local_70.__d.__r = (duration)(duration)dStack_ef0.__r;
        end_time = (time_t)std::chrono::operator-(&local_70,&end);
        local_f00.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)&end_time);
        rVar19 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_f00);
        local_ef4 = (int)rVar19;
        local_f10 = std::chrono::_V2::system_clock::to_time_t(&local_70);
        poVar9 = std::operator<<((ostream *)&std::cout,"Finished computation at ");
        pcVar20 = ctime(&local_f10);
        poVar9 = std::operator<<(poVar9,pcVar20);
        poVar9 = std::operator<<(poVar9," Elapsed time: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_ef4);
        poVar9 = std::operator<<(poVar9," ms");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
        std::__cxx11::string::~string(local_eb0);
        std::__cxx11::stringstream::~stringstream((stringstream *)(s.field_2._M_local_buf + 8));
        cv::Mat::~Mat((Mat *)local_b90);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_aa8);
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)
                   &shadowPoints.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
        ::~map((map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                *)&labIt);
        cv::Mat::~Mat((Mat *)local_7a0);
        cv::Mat::~Mat(local_6d8);
        cv::Mat::~Mat(local_678);
        cv::Mat::~Mat(local_618);
        cv::Mat::~Mat(local_588);
        cv::Mat::~Mat(local_4f8);
        cv::Mat::~Mat(local_468);
        cv::Mat::~Mat(local_408);
        cv::Mat::~Mat(local_3a8);
        cv::Mat::~Mat((Mat *)local_348);
        local_11b8 = &local_1c8;
        do {
          local_11b8 = local_11b8 + -4;
          cv::Mat::~Mat((Mat *)local_11b8);
        } while (local_11b8 != local_2e8);
        cv::Mat::~Mat(local_198);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "Wrong argument! Can not open input image. Check for errors in the provided path"
                                );
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "Run this executable by invoking it like this: ");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 50 50 50"
                                );
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      cv::Mat::~Mat(local_d8);
    }
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"Run this executable by invoking it like this: ")
    ;
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"The first argument is the input image path.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "The second argument is the lStep parameter. It must be positive.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "The third argument is the aStep parameter. It must be positive.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "The fourth argument is the bStep parameter. It must be positive.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv){

  if (argc != 5){
    cout << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50" << endl;
    cout << endl;
    cout << "The first argument is the input image path." << endl;
    cout << "The second argument is the lStep parameter. It must be positive." << endl;
    cout << "The third argument is the aStep parameter. It must be positive." << endl;
    cout << "The fourth argument is the bStep parameter. It must be positive." << endl;
    cout << endl;
    return 1;
  }

  const string srcPath = argv[1];
  const int lStep = atoi(argv[2]);
  const int aStep = atoi(argv[3]);
  const int bStep = atoi(argv[4]);

  if(aStep <= 0 || bStep <=0 || lStep <= 0){
    cout << endl;
    cout << "Wrong argument! lStep, aStep and bStep must be positive." << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50" << endl;
    cout << endl;
    return 1;
  }

  chrono::time_point<chrono::system_clock> start, end;
  start = chrono::system_clock::now();

  Mat imgRGB;
  imgRGB = imread(srcPath);

  if(imgRGB.empty()){
    cout << "Wrong argument! Can not open input image. Check for errors in the provided path" << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 50 50 50" << endl;
    cout << endl;
    return 1;
  }

  // in this process we use CIE LAB color space
  Mat imgLAB;
  cvtColor(imgRGB, imgLAB, COLOR_RGB2Lab);

  Mat channelLAB[3];
  split(imgLAB, channelLAB);
  Mat imgL = channelLAB[0];
  Mat imgA = channelLAB[1];
  Mat imgB = channelLAB[2];

  //bilateral filter to reduce noise but preserve edges
  Mat lFiltered;
  bilateralFilter(imgL, lFiltered, 5, 80, 80);
  imgL = lFiltered;
  lFiltered.release();

  Mat aFiltered;
  bilateralFilter(imgA, aFiltered, 5, 80, 80);
  imgA = aFiltered;
  aFiltered.release();

  Mat bFiltered;
  bilateralFilter(imgB, bFiltered, 5, 80, 80);
  imgB = bFiltered;
  bFiltered.release();

  // compute the mean and the standard deviation of the luminance component
  // these values are considered as the "background light" so they allow to
  // distinguish "probably shadow pixels" (PSP) from surely "not shadow pixels" (NSP)
  Mat imgLD, meanL, stdDevL;
  bool useSTD = true;
  imgL.convertTo(imgLD, CV_64FC1);
  meanStdDev(imgLD, meanL, stdDevL);
  if(stdDevL.at<double> (0, 0) <  (double) 255 / 6){
    useSTD = false;
  }

  cout << "Mean lightness value: " << meanL.at<double> (0, 0) << ", standard deviation: " << stdDevL.at<double> (0, 0)
       << " useSTD: " << useSTD << endl;

  // create the mask
  Mat maskAvgL = Mat_<uchar>::zeros(imgL.size());

  // depending on the standard deviation on imgL, each pixel with lightness component less than meanL - stdDevL/3
  // or simply meanL is a PSP, otherwise it is a NSP.
  // in the resulting masks, each PSP value is set to the one assumed in the luminance image plus 1
  // while each NSP remains set to 0
  int maskPixels = 0;
  for(int i = 0; i < maskAvgL.rows; i++){
    for(int j = 0; j < maskAvgL.cols; j++){
      if(useSTD){
        if(imgLD.at<double> (i, j) < (meanL.at<double> (0, 0) - (stdDevL.at<double> (0, 0) / 3))){
          maskAvgL.at<uchar> (i, j) = 1 + imgL.at<uchar> (i, j);
          maskPixels++;
        }
        else{
          maskAvgL.at<uchar> (i, j) = 0;
        }
      }
      else{
        if(imgLD.at<double> (i, j) < meanL.at<double> (0, 0)){
          maskAvgL.at<uchar> (i, j) = 1 + imgL.at<uchar> (i, j);
          maskPixels++;
        }
        else{
          maskAvgL.at<uchar> (i, j) = 0;
        }
      }
    }
  }

  // write the files to see results
  imwrite("../results/mask_step_one.jpg", maskAvgL);

  // now further computation to detect the shadow pixels (SP) from the PSP
  map<tuple<int, int, int> , vector<Point> > labMap;
  map<tuple<int, int, int>, vector<Point> >::iterator labIt;

  // fill  labMap:
  // key = (l*, a*, b*) pixel component. It represents a color bin
  // value = points of the mask in the bin
  for (int i = 0; i < maskAvgL.rows; i++){
    for (int j = 0; j < maskAvgL.cols; j++){
      if (maskAvgL.at<uchar> (i, j) != 0){
        Point p(i, j);
        int theL = ceil(imgL.at<uchar> (i, j) / lStep);
        int theA = ceil(imgA.at<uchar> (i, j) / aStep);
        int theB = ceil(imgB.at<uchar> (i, j) / bStep);
        tuple<int, int, int> key = make_tuple(theL, theA, theB);

        labIt = labMap.find(key);
        if(labIt == labMap.end()){
          vector<Point> v;
          v.push_back(p);
          labMap.insert(pair<tuple<int, int, int>, vector<Point> >(key, v));
        }
        else{
          labMap[key].push_back(p);
        }
      }
    }
  }

  int labMapPixels = 0;
  for (labIt = labMap.begin(); labIt != labMap.end(); labIt++){
    vector<Point> labPixels = labIt->second;
    labMapPixels = labMapPixels + labPixels.size();
  }

  if(maskPixels == labMapPixels){
    cout << "labMap succesfully created. Entries in labMap: " << labMap.size() << endl;
  }

  // use thread pool to analyze each (key, value) pair in labMap
  const int poolSize = thread::hardware_concurrency();
  cout << "Max threads concurrent: " << poolSize << endl;
  vector<thread> threads;
  vector<Point> shadowPoints;
  labIt = labMap.begin();

  while(labIt != labMap.end()){
    if(threads.size() < poolSize){
      // lauch thread form the pool. See FindShadow.cpp for more information
      threads.push_back(thread(findShadow, imgL, imgA, imgB, labIt->first, labIt->second, lStep, aStep, bStep, ref(shadowPoints)));
      labIt++; // move to the next (key, value) pair in labMap
    }
    else{
      // wait for threads to finish their computation
      for(int t = 0; t < threads.size(); t++){
        threads[t].join();
      }
      // free the pool
      threads.erase(threads.begin(), threads.end());
    }
  }

  // wait for active threads remaining
  for(int t = 0; t < threads.size(); t++){
    threads[t].join();
  }
  // free the pool
  threads.erase(threads.begin(), threads.end());

  // write the final result
  Mat maskFinal = Mat_<uchar>::zeros(maskAvgL.size());

  for (int i = 0; i < shadowPoints.size(); i++){
    Point p = shadowPoints[i];
    maskFinal.at<uchar> (p.x, p.y) = 255;
  }

  stringstream sstm;
  sstm << "../results/mask_step_two_lStep" << lStep << "_aStep" << aStep << "_bStep" << bStep << ".jpg";
  string s = sstm.str();
  imwrite(s, maskFinal);

  // provide information to the user
  end = chrono::system_clock::now();
  int elapsed_seconds = chrono::duration_cast<std::chrono::milliseconds> (end-start).count();
  time_t end_time = chrono::system_clock::to_time_t(end);

  cout << "Finished computation at " << ctime(&end_time) << " Elapsed time: " << elapsed_seconds << " ms" << endl;

  return 0;
}